

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsReceiveQueue.cpp
# Opt level: O0

BufferPtr __thiscall Scs::ReceiveQueue::Pop(ReceiveQueue *this)

{
  bool bVar1;
  reference pvVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  queue<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_std::deque<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>_>
  *in_RSI;
  BufferPtr BVar3;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  ReceiveQueue *this_local;
  BufferPtr *buffer;
  
  std::lock_guard<std::mutex>::lock_guard(&local_20,(mutex_type *)(in_RSI + 1));
  bVar1 = std::
          queue<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_std::deque<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>_>
          ::empty(in_RSI);
  if (bVar1) {
    std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>::shared_ptr
              ((shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_> *)this,
               (nullptr_t)0x0);
  }
  else {
    pvVar2 = std::
             queue<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_std::deque<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>_>
             ::front(in_RSI);
    std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>::shared_ptr
              ((shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_> *)this,
               pvVar2);
    std::
    queue<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_std::deque<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>_>
    ::pop(in_RSI);
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  BVar3.
  super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  BVar3.
  super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (BufferPtr)
         BVar3.
         super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

BufferPtr ReceiveQueue::Pop()
{
	std::lock_guard<std::mutex> lock(m_mutex);
	if (m_queue.empty())
		return nullptr;
	BufferPtr buffer = m_queue.front();
	m_queue.pop();
	return buffer;
}